

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBlock.cpp
# Opt level: O1

void __thiscall
Memory::LargeObjectHeader::SetNext(LargeObjectHeader *this,uint cookie,LargeObjectHeader *next)

{
  ushort uVar1;
  
  uVar1 = this->attributesAndChecksum ^ (ushort)cookie;
  this->attributesAndChecksum =
       (((ushort)((ulong)next >> 0x18) & 0xff ^ (ushort)next ^
        (ushort)((ulong)next >> 0x10) ^ (ushort)((ulong)next >> 8)) & 0xff ^ uVar1 >> 8 |
       uVar1 & 0xff00) ^ (ushort)cookie;
  this->next = (LargeObjectHeader *)((ulong)cookie ^ (ulong)next);
  return;
}

Assistant:

void
LargeObjectHeader::SetNext(uint cookie, LargeObjectHeader* next)
{
#ifdef LARGEHEAPBLOCK_ENCODING
    ushort decodedAttributesAndChecksum = this->DecodeAttributesAndChecksum(cookie);

    // Calculate the checksum value with new next
    unsigned char newCheckSumValue = this->CalculateCheckSum(next, (unsigned char)(decodedAttributesAndChecksum >> 8));
    // pack the (attribute + checksum)
    ushort newAttributeWithCheckSum = (decodedAttributesAndChecksum & 0xFF00) | newCheckSumValue;

    // encode the packed (attribute + checksum), next and set them
    this->attributesAndChecksum = this->EncodeAttributesAndChecksum(cookie, newAttributeWithCheckSum);
    this->next = this->EncodeNext(cookie, next);
#else
    this->next = next;
#endif
}